

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmeticmodel.cpp
# Opt level: O1

void __thiscall ArithmeticBitModel::ArithmeticBitModel(ArithmeticBitModel *this)

{
  this->bit_count = 2;
  this->bit_0_prob = 0x1000;
  this->bit_0_count = 1;
  this->update_cycle = 4;
  this->bits_until_update = 4;
  return;
}

Assistant:

void ArithmeticBitModel::init()
{
  // initialization to equiprobable model
  bit_0_count = 1;
  bit_count   = 2;
  bit_0_prob  = 1U << (BM__LengthShift - 1);
  // start with frequent updates
  update_cycle = bits_until_update = 4;
}